

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O0

void __thiscall
ncnn::Convolution::make_padding
          (Convolution *this,Mat *bottom_blob,Mat *bottom_blob_bordered,Option *opt)

{
  void *in_RCX;
  long in_RSI;
  long in_RDI;
  Option opt_b_2;
  int hpad_1;
  int wpad_1;
  Option opt_b_1;
  int hpad;
  int wpad;
  Option opt_b;
  int kernel_extent_h;
  int kernel_extent_w;
  int h;
  int w;
  float in_stack_00000834;
  int in_stack_00000838;
  int in_stack_0000083c;
  int in_stack_00000840;
  int in_stack_00000844;
  Mat *in_stack_00000848;
  Mat *in_stack_00000850;
  int in_stack_00000860;
  Option *in_stack_00000868;
  Mat *in_stack_ffffffffffffff10;
  Mat *in_stack_ffffffffffffff18;
  undefined1 local_b8 [8];
  undefined8 local_b0;
  int local_90;
  int local_8c;
  undefined1 local_88 [8];
  undefined8 local_80;
  int local_60;
  int local_5c;
  undefined1 local_58 [8];
  undefined8 local_50;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  void *local_20;
  
  local_24 = *(int *)(in_RSI + 0x2c);
  local_28 = *(int *)(in_RSI + 0x30);
  local_2c = *(int *)(in_RDI + 0xc4) * (*(int *)(in_RDI + 0xbc) + -1) + 1;
  local_30 = *(int *)(in_RDI + 200) * (*(int *)(in_RDI + 0xc0) + -1) + 1;
  local_20 = in_RCX;
  ncnn::Mat::operator=(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  if ((((*(int *)(in_RDI + 0xd4) < 1) && (*(int *)(in_RDI + 0xd8) < 1)) &&
      (*(int *)(in_RDI + 0xdc) < 1)) && (*(int *)(in_RDI + 0xe0) < 1)) {
    if (((*(int *)(in_RDI + 0xd4) == -0xe9) && (*(int *)(in_RDI + 0xd8) == -0xe9)) &&
       ((*(int *)(in_RDI + 0xdc) == -0xe9 && (*(int *)(in_RDI + 0xe0) == -0xe9)))) {
      local_5c = (local_2c + ((local_24 + -1) / *(int *)(in_RDI + 0xcc)) * *(int *)(in_RDI + 0xcc))
                 - local_24;
      local_60 = (local_30 + ((local_28 + -1) / *(int *)(in_RDI + 0xd0)) * *(int *)(in_RDI + 0xd0))
                 - local_28;
      if ((0 < local_5c) || (0 < local_60)) {
        memcpy(local_88,local_20,0x28);
        local_80 = *(undefined8 *)((long)local_20 + 0x10);
        copy_make_border(in_stack_00000850,in_stack_00000848,in_stack_00000844,in_stack_00000840,
                         in_stack_0000083c,in_stack_00000838,in_stack_00000860,in_stack_00000834,
                         in_stack_00000868);
      }
    }
    else if (((*(int *)(in_RDI + 0xd4) == -0xea) && (*(int *)(in_RDI + 0xd8) == -0xea)) &&
            ((*(int *)(in_RDI + 0xdc) == -0xea && (*(int *)(in_RDI + 0xe0) == -0xea)))) {
      local_8c = (local_2c + ((local_24 + -1) / *(int *)(in_RDI + 0xcc)) * *(int *)(in_RDI + 0xcc))
                 - local_24;
      local_90 = (local_30 + ((local_28 + -1) / *(int *)(in_RDI + 0xd0)) * *(int *)(in_RDI + 0xd0))
                 - local_28;
      if ((0 < local_8c) || (0 < local_90)) {
        memcpy(local_b8,local_20,0x28);
        local_b0 = *(undefined8 *)((long)local_20 + 0x10);
        copy_make_border(in_stack_00000850,in_stack_00000848,in_stack_00000844,in_stack_00000840,
                         in_stack_0000083c,in_stack_00000838,in_stack_00000860,in_stack_00000834,
                         in_stack_00000868);
      }
    }
  }
  else {
    memcpy(local_58,local_20,0x28);
    local_50 = *(undefined8 *)((long)local_20 + 0x10);
    copy_make_border(in_stack_00000850,in_stack_00000848,in_stack_00000844,in_stack_00000840,
                     in_stack_0000083c,in_stack_00000838,in_stack_00000860,in_stack_00000834,
                     in_stack_00000868);
  }
  return;
}

Assistant:

void Convolution::make_padding(const Mat& bottom_blob, Mat& bottom_blob_bordered, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    bottom_blob_bordered = bottom_blob;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
    {
        // tensorflow padding=SAME or onnx padding=SAME_UPPER
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
    else if (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234)
    {
        // onnx padding=SAME_LOWER
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad - hpad / 2, hpad / 2, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
}